

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O1

int set_socket_blocking(int socket)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = fcntl(socket,3);
  if (uVar2 == 0xffffffff) {
    iVar3 = -1;
  }
  else {
    iVar3 = fcntl(socket,4,(ulong)(uVar2 & 0xfffff7ff));
    iVar3 = -(uint)(iVar3 == -1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int set_socket_blocking(int socket)
{
	int flags = fcntl(socket, F_GETFL);

	if (flags == -1)
		return TR_ERROR;

	flags &= ~O_NONBLOCK;

	if (fcntl(socket, F_SETFL, flags) == -1)
		return TR_ERROR;

	return TR_SUCCESS;
}